

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O2

void av1_calc_proj_params_high_bd_avx2
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  long lVar7;
  long lVar8;
  int j;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  int64_t aiVar14 [2];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    lVar7 = (long)src8 * 2;
    lVar8 = (long)dat8 * 2;
    uVar10 = 0;
    uVar6 = 0;
    if (0 < height) {
      uVar6 = (ulong)(uint)height;
    }
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    for (; uVar10 != uVar6; uVar10 = uVar10 + 1) {
      for (lVar9 = 0; lVar9 < width; lVar9 = lVar9 + 8) {
        auVar3 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar8 + lVar9 * 2));
        auVar17 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar7 + lVar9 * 2));
        auVar21 = vpslld_avx2(auVar3,4);
        auVar4 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar9),auVar21);
        auVar3 = vpsubd_avx2(auVar17,auVar3);
        auVar15 = vpslld_avx2(auVar3,4);
        auVar3 = vpmuldq_avx2(auVar4,auVar4);
        auVar21 = vpshufd_avx2(auVar4,0xf5);
        auVar17 = vpmuldq_avx2(auVar21,auVar21);
        auVar3 = vpaddq_avx2(auVar13._0_32_,auVar3);
        auVar3 = vpaddq_avx2(auVar17,auVar3);
        auVar13 = ZEXT3264(auVar3);
        auVar3 = vpmuldq_avx2(auVar15,auVar4);
        auVar17 = vpsrlq_avx2(auVar15,0x20);
        auVar17 = vpmuldq_avx2(auVar17,auVar21);
        auVar3 = vpaddq_avx2(auVar12._0_32_,auVar3);
        auVar3 = vpaddq_avx2(auVar17,auVar3);
        auVar12 = ZEXT3264(auVar3);
      }
      flt1 = flt1 + flt1_stride;
      lVar7 = lVar7 + (long)src_stride * 2;
      lVar8 = lVar8 + (long)dat_stride * 2;
    }
    auVar1 = vpaddq_avx(auVar13._16_16_,auVar13._0_16_);
    auVar11 = vpshufd_avx(auVar1,0xee);
    auVar1 = vpaddq_avx(auVar1,auVar11);
    auVar11 = vpaddq_avx(auVar12._16_16_,auVar12._0_16_);
    auVar2 = vpshufd_avx(auVar11,0xee);
    auVar11 = vpaddq_avx(auVar11,auVar2);
    auVar11 = vpslldq_avx(auVar11,8);
    aiVar14 = (int64_t  [2])vpslldq_avx(auVar1,8);
    *(undefined1 (*) [16])C = auVar11;
    H[1] = aiVar14;
    lVar7 = (long)(height * width);
    H[1][1] = auVar1._0_8_ / lVar7;
  }
  else {
    lVar7 = (long)src8 * 2;
    lVar8 = (long)dat8 * 2;
    if (params->r[1] < 1) {
      uVar10 = 0;
      uVar6 = 0;
      if (0 < height) {
        uVar6 = (ulong)(uint)height;
      }
      auVar12 = ZEXT1664((undefined1  [16])0x0);
      auVar13 = ZEXT1664((undefined1  [16])0x0);
      for (; uVar10 != uVar6; uVar10 = uVar10 + 1) {
        for (lVar9 = 0; lVar9 < width; lVar9 = lVar9 + 8) {
          auVar3 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar8 + lVar9 * 2));
          auVar17 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar7 + lVar9 * 2));
          auVar21 = vpslld_avx2(auVar3,4);
          auVar4 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar9),auVar21);
          auVar3 = vpsubd_avx2(auVar17,auVar3);
          auVar15 = vpslld_avx2(auVar3,4);
          auVar3 = vpmuldq_avx2(auVar4,auVar4);
          auVar21 = vpshufd_avx2(auVar4,0xf5);
          auVar17 = vpmuldq_avx2(auVar21,auVar21);
          auVar3 = vpaddq_avx2(auVar13._0_32_,auVar3);
          auVar3 = vpaddq_avx2(auVar17,auVar3);
          auVar13 = ZEXT3264(auVar3);
          auVar3 = vpmuldq_avx2(auVar15,auVar4);
          auVar17 = vpsrlq_avx2(auVar15,0x20);
          auVar17 = vpmuldq_avx2(auVar17,auVar21);
          auVar3 = vpaddq_avx2(auVar12._0_32_,auVar3);
          auVar3 = vpaddq_avx2(auVar17,auVar3);
          auVar12 = ZEXT3264(auVar3);
        }
        flt0 = flt0 + flt0_stride;
        lVar7 = lVar7 + (long)src_stride * 2;
        lVar8 = lVar8 + (long)dat_stride * 2;
      }
      auVar1 = vpaddq_avx(auVar13._16_16_,auVar13._0_16_);
      auVar11 = vpshufd_avx(auVar1,0xee);
      auVar1 = vpaddq_avx(auVar1,auVar11);
      auVar11 = vpaddq_avx(auVar12._16_16_,auVar12._0_16_);
      auVar2 = vpshufd_avx(auVar11,0xee);
      auVar11 = vpaddq_avx(auVar11,auVar2);
      *C = auVar11._0_8_;
      C[1] = 0;
      (*H)[0] = auVar1._0_8_;
      (*H)[1] = 0;
      lVar7 = (long)(height * width);
      (*H)[0] = auVar1._0_8_ / lVar7;
      goto LAB_003f0da9;
    }
    uVar10 = 0;
    uVar6 = 0;
    if (0 < height) {
      uVar6 = (ulong)(uint)height;
    }
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    for (; uVar10 != uVar6; uVar10 = uVar10 + 1) {
      for (lVar9 = 0; lVar9 < width; lVar9 = lVar9 + 8) {
        auVar3 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar8 + lVar9 * 2));
        auVar17 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar7 + lVar9 * 2));
        auVar21 = vpslld_avx2(auVar3,4);
        auVar3 = vpsubd_avx2(auVar17,auVar3);
        auVar20 = vpslld_avx2(auVar3,4);
        auVar15 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar9),auVar21);
        auVar5 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar9),auVar21);
        auVar3 = vpmuldq_avx2(auVar15,auVar15);
        auVar21 = vpshufd_avx2(auVar15,0xf5);
        auVar17 = vpmuldq_avx2(auVar21,auVar21);
        auVar3 = vpaddq_avx2(auVar3,auVar18._0_32_);
        auVar3 = vpaddq_avx2(auVar17,auVar3);
        auVar18 = ZEXT3264(auVar3);
        auVar3 = vpmuldq_avx2(auVar5,auVar15);
        auVar4 = vpshufd_avx2(auVar5,0xf5);
        auVar17 = vpmuldq_avx2(auVar4,auVar21);
        auVar3 = vpaddq_avx2(auVar3,auVar16._0_32_);
        auVar3 = vpaddq_avx2(auVar17,auVar3);
        auVar16 = ZEXT3264(auVar3);
        auVar3 = vpmuldq_avx2(auVar5,auVar5);
        auVar17 = vpmuldq_avx2(auVar4,auVar4);
        auVar3 = vpaddq_avx2(auVar3,auVar12._0_32_);
        auVar3 = vpaddq_avx2(auVar17,auVar3);
        auVar12 = ZEXT3264(auVar3);
        auVar3 = vpmuldq_avx2(auVar20,auVar15);
        auVar15 = vpshufd_avx2(auVar20,0xf5);
        auVar17 = vpmuldq_avx2(auVar15,auVar21);
        auVar3 = vpaddq_avx2(auVar19._0_32_,auVar3);
        auVar3 = vpaddq_avx2(auVar17,auVar3);
        auVar19 = ZEXT3264(auVar3);
        auVar3 = vpmuldq_avx2(auVar5,auVar20);
        auVar17 = vpmuldq_avx2(auVar4,auVar15);
        auVar3 = vpaddq_avx2(auVar13._0_32_,auVar3);
        auVar3 = vpaddq_avx2(auVar17,auVar3);
        auVar13 = ZEXT3264(auVar3);
      }
      flt1 = flt1 + flt1_stride;
      flt0 = flt0 + flt0_stride;
      lVar7 = lVar7 + (long)src_stride * 2;
      lVar8 = lVar8 + (long)dat_stride * 2;
    }
    auVar17 = vpunpcklqdq_avx2(auVar19._0_32_,auVar13._0_32_);
    auVar3 = vpunpckhqdq_avx2(auVar19._0_32_,auVar13._0_32_);
    auVar3 = vpaddq_avx2(auVar17,auVar3);
    auVar1 = vpaddq_avx(auVar3._16_16_,auVar3._0_16_);
    auVar17 = vpunpcklqdq_avx2(auVar18._0_32_,auVar16._0_32_);
    auVar3 = vpunpckhqdq_avx2(auVar18._0_32_,auVar16._0_32_);
    auVar3 = vpaddq_avx2(auVar17,auVar3);
    auVar11 = vpaddq_avx(auVar3._16_16_,auVar3._0_16_);
    auVar17 = vpslldq_avx2(auVar12._0_32_,8);
    auVar3 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar12._0_32_,0xcc);
    auVar3 = vpaddq_avx2(auVar17,auVar3);
    auVar2 = vpaddq_avx(auVar3._16_16_,auVar3._0_16_);
    *(undefined1 (*) [16])C = auVar1;
    lVar7 = (long)(height * width);
    (*H)[0] = auVar11._0_8_ / lVar7;
    lVar8 = vpextrq_avx(auVar11,1);
    (*H)[1] = lVar8 / lVar7;
    lVar9 = vpextrq_avx(auVar2,1);
    H[1][1] = lVar9 / lVar7;
    H[1][0] = lVar8 / lVar7;
    *C = *C / lVar7;
  }
  C = C + 1;
LAB_003f0da9:
  *C = *C / lVar7;
  return;
}

Assistant:

void av1_calc_proj_params_high_bd_avx2(const uint8_t *src8, int width,
                                       int height, int src_stride,
                                       const uint8_t *dat8, int dat_stride,
                                       int32_t *flt0, int flt0_stride,
                                       int32_t *flt1, int flt1_stride,
                                       int64_t H[2][2], int64_t C[2],
                                       const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_high_bd_avx2(src8, width, height, src_stride, dat8,
                                        dat_stride, flt0, flt0_stride, flt1,
                                        flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_high_bd_avx2(src8, width, height, src_stride, dat8,
                                     dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_high_bd_avx2(src8, width, height, src_stride, dat8,
                                     dat_stride, flt1, flt1_stride, H, C);
  }
}